

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O0

void avlUpdateNode(NodeAVL **tree,NodeAVL *nd,double key)

{
  NodeAVL *pNVar1;
  NodeAVL *in_RSI;
  undefined8 *in_RDI;
  NodeAVL *in_XMM0_Qa;
  
  avlGoUp(in_XMM0_Qa);
  pNVar1 = avlRemove0(in_XMM0_Qa,0);
  *in_RDI = pNVar1;
  in_RSI->key = (double)in_XMM0_Qa;
  clearTreeMatters(in_RSI);
  pNVar1 = avlInsert0(in_XMM0_Qa,(NodeAVL *)0x10d49d);
  *in_RDI = pNVar1;
  return;
}

Assistant:

void avlUpdateNode( NodeAVL **tree, NodeAVL* nd, const double key ){
    #ifdef DEBUG_AVL
      printf( "avlUpdateNode id=%d\n", nd->id );
    #endif
    *tree = avlRemove0( avlGoUp( nd ), 0 );
    nd->key = key;
    clearTreeMatters( nd );
    *tree = avlInsert0( *tree, nd );
}